

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator.hpp
# Opt level: O0

void __thiscall boost::unit_test::decorator::label::~label(label *this)

{
  void *in_RDI;
  
  ~label((label *)0x247fd8);
  operator_delete(in_RDI,0x18);
  return;
}

Assistant:

class BOOST_TEST_DECL label : public decorator::base {
public:
    explicit                label( const_string l ) : m_label( l ) {}

private:
    // decorator::base interface
    virtual void            apply( test_unit& tu );
    virtual base_ptr        clone() const { return base_ptr(new label( m_label )); }

    // Data members
    const_string            m_label;
}